

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O2

void __thiscall
NewEdgeCalculator::iterateRemainingCovAp2
          (NewEdgeCalculator *this,AlignmentRecord *ap2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          bool pe1,AlignmentRecord *ap1,int *tc,double *prob0,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          bool pe2,uint *pos2)

{
  uint uVar1;
  uint uVar2;
  pointer pmVar3;
  ulong uVar4;
  double dVar5;
  
  do {
    uVar1 = *pos2;
    pmVar3 = (cov_ap2->
             super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(cov_ap2->
                       super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3) / 0x18) <=
        (ulong)uVar1) {
      return;
    }
    pmVar3 = pmVar3 + uVar1;
    if (pe1 && pe2) {
      uVar1 = AlignmentRecord::getStart2(ap2);
      uVar2 = AlignmentRecord::getEnd2(ap1);
      if ((uVar2 < uVar1) &&
         (uVar1 = pmVar3->ref, uVar2 = AlignmentRecord::getStart2(ap2), uVar2 <= uVar1)) {
        return;
      }
      dVar5 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pmVar3->ref];
      uVar4 = -(ulong)(dVar5 != 0.0);
      dVar5 = (double)(~uVar4 & 0xbfe34413509f79ff | (ulong)dVar5 & uVar4) + *prob0;
      uVar1 = *pos2;
    }
    else {
      if (pmVar3->read !=
          (cov_ap1->
          super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>)
          ._M_impl.super__Vector_impl_data._M_finish[-1].read) {
        return;
      }
      dVar5 = (this->SIMPSON_MAP).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[pmVar3->ref];
      uVar4 = -(ulong)(dVar5 != 0.0);
      dVar5 = (double)(~uVar4 & 0xbfe34413509f79ff | (ulong)dVar5 & uVar4) + *prob0;
    }
    *prob0 = dVar5;
    *pos2 = uVar1 + 1;
    *tc = *tc + 1;
  } while( true );
}

Assistant:

void NewEdgeCalculator::iterateRemainingCovAp2(const AlignmentRecord& ap2, const std::vector<AlignmentRecord::mapValue>& cov_ap2, bool pe1, const AlignmentRecord& ap1, int& tc, double& prob0, const std::vector<AlignmentRecord::mapValue>& cov_ap1, bool pe2, unsigned int& pos2) const
{
    while(pos2 < cov_ap2.size()){
        auto& v2 = cov_ap2[pos2];
        if(pe1 && pe2){
            if(ap2.getStart2() > ap1.getEnd2() && v2.ref >= ap2.getStart2()) break;
            else {
                calculateProb0(v2,prob0);
                pos2++;
                tc++;
            }
        }
       else if (v2.read == cov_ap1.back().read){
            calculateProb0(v2,prob0);
            pos2++;
            tc++;
        } else break;
    }
}